

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

uint fmt::v5::internal::
     parse_nonnegative_int<char,fmt::v5::internal::width_adapter<fmt::v5::formatter<std::chrono::duration<int,std::ratio<1000000000000000000l,1l>>,char,void>::spec_handler&,char>&>
               (char **begin,char *end,
               width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1000000000000000000L,_1L>_>,_char,_void>::spec_handler_&,_char>
               *eh)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  
  cVar2 = **begin;
  pcVar1 = *begin + 1;
  if (cVar2 == '0') {
    *begin = pcVar1;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (0xccccccc < uVar3) {
        uVar3 = 0x80000000;
        goto LAB_0011f479;
      }
      uVar3 = (uVar3 * 10 + (int)cVar2) - 0x30;
      *begin = pcVar1;
      if (pcVar1 == end) break;
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while ((byte)(cVar2 - 0x30U) < 10);
    if ((int)uVar3 < 0) {
LAB_0011f479:
      width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1000000000000000000L,_1L>_>,_char,_void>::spec_handler_&,_char>
      ::on_error(eh,"number is too big");
    }
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}